

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanMemoryManager.cpp
# Opt level: O2

VulkanMemoryAllocation * __thiscall
VulkanUtilities::VulkanMemoryManager::Allocate
          (VulkanMemoryAllocation *__return_storage_ptr__,VulkanMemoryManager *this,
          VkDeviceSize Size,VkDeviceSize Alignment,uint32_t MemoryTypeIndex,bool HostVisible,
          VkMemoryAllocateFlags AllocateFlags)

{
  atomic<long> *paVar1;
  _Alloc_hider _Var2;
  ulong uVar3;
  ulong uVar4;
  iterator iVar5;
  type tVar6;
  ulong uVar7;
  char (*Args_1) [112];
  _Node_iterator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_false,_true>
  page_it;
  _Node_iterator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_false,_true>
  _Var8;
  VkDeviceSize size;
  char *Args_2;
  undefined8 uVar9;
  size_type val;
  pair<std::__detail::_Node_iterator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_false,_true>_>
  pVar10;
  uint32_t MemoryTypeIndex_local;
  VulkanMemoryAllocation *local_1b0;
  VkDeviceSize local_1a8;
  char (*local_1a0) [112];
  MemoryPageIndex PageIdx;
  _Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
  local_170;
  string _msg;
  unsigned_long local_60;
  char local_58 [8];
  char local_50 [8];
  ulong local_48;
  char local_40 [8];
  undefined8 local_38;
  
  __return_storage_ptr__->Page = (VulkanMemoryPage *)0x0;
  __return_storage_ptr__->UnalignedOffset = 0;
  __return_storage_ptr__->Size = 0;
  PageIdx.AllocateFlags = AllocateFlags;
  MemoryTypeIndex_local = MemoryTypeIndex;
  local_1b0 = __return_storage_ptr__;
  local_1a8 = Size;
  local_1a0 = (char (*) [112])Alignment;
  PageIdx.MemoryTypeIndex = MemoryTypeIndex;
  PageIdx.IsHostVisible = HostVisible;
  std::mutex::lock(&this->m_PagesMtx);
  pVar10 = std::
           _Hashtable<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_std::allocator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>_>,_std::__detail::_Select1st,_std::equal_to<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex>,_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
           ::equal_range(&(this->m_Pages)._M_h,&PageIdx);
  while( true ) {
    size = local_1a8;
    local_170._M_cur =
         (__node_type *)
         pVar10.second.
         super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
         ._M_cur;
    _Var8 = pVar10.first.
            super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
            ._M_cur;
    if (_Var8.
        super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
        ._M_cur ==
        (_Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
         )local_170._M_cur) break;
    Args_1 = local_1a0;
    VulkanMemoryPage::Allocate
              ((VulkanMemoryAllocation *)&_msg,
               (VulkanMemoryPage *)
               ((long)_Var8.
                      super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
                      ._M_cur + 0x18),local_1a8,(VkDeviceSize)local_1a0);
    uVar9 = _msg.field_2._M_allocated_capacity;
    val = _msg._M_string_length;
    _Var2 = _msg._M_dataplus;
    local_1b0->Page = (VulkanMemoryPage *)_msg._M_dataplus._M_p;
    local_1b0->UnalignedOffset = _msg._M_string_length;
    local_1b0->Size = _msg.field_2._M_allocated_capacity;
    _msg._M_dataplus._M_p = (pointer)0x0;
    _msg._M_string_length = 0;
    _msg.field_2._M_allocated_capacity = 0;
    VulkanMemoryAllocation::~VulkanMemoryAllocation((VulkanMemoryAllocation *)&_msg);
    size = local_1a8;
    if (_Var2._M_p != (pointer)0x0) goto LAB_00279aaf;
    pVar10.second.
    super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
    ._M_cur = (_Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
               )(_Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
                 )local_170._M_cur;
    pVar10.first.
    super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
    ._M_cur = (_Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
               )(__node_type *)
                *(_Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
                  *)_Var8.
                    super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
                    ._M_cur;
  }
  uVar7 = *(VkDeviceSize *)((long)(&this->m_CurrUsedSize + -2) + (ulong)HostVisible * 8);
  do {
    uVar3 = uVar7;
    uVar7 = uVar3 * 2;
  } while (uVar3 < local_1a8);
  uVar4 = (this->m_CurrAllocatedSize)._M_elems[HostVisible] + uVar3;
  (this->m_CurrAllocatedSize)._M_elems[HostVisible] = uVar4;
  uVar7 = (this->m_PeakAllocatedSize)._M_elems[HostVisible];
  if (uVar4 < uVar7) {
    uVar4 = uVar7;
  }
  (this->m_PeakAllocatedSize)._M_elems[HostVisible] = uVar4;
  VulkanMemoryPage::VulkanMemoryPage
            ((VulkanMemoryPage *)&_msg,this,uVar3,MemoryTypeIndex_local,HostVisible,AllocateFlags);
  iVar5 = std::
          _Hashtable<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,std::pair<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex_const,VulkanUtilities::VulkanMemoryPage>,std::allocator<std::pair<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex_const,VulkanUtilities::VulkanMemoryPage>>,std::__detail::_Select1st,std::equal_to<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex>,VulkanUtilities::VulkanMemoryManager::MemoryPageIndex::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
          ::
          _M_emplace<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex&,VulkanUtilities::VulkanMemoryPage>
                    ((_Hashtable<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,std::pair<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex_const,VulkanUtilities::VulkanMemoryPage>,std::allocator<std::pair<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex_const,VulkanUtilities::VulkanMemoryPage>>,std::__detail::_Select1st,std::equal_to<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex>,VulkanUtilities::VulkanMemoryManager::MemoryPageIndex::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                      *)&this->m_Pages,&PageIdx,&_msg);
  VulkanMemoryPage::~VulkanMemoryPage((VulkanMemoryPage *)&_msg);
  Args_2 = "device-local";
  if (HostVisible) {
    Args_2 = "host-visible";
  }
  local_58[0] = '\x02';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_38 = 0;
  local_60 = (this->m_CurrAllocatedSize)._M_elems[HostVisible];
  local_50[0] = '\0';
  local_50[1] = '\0';
  local_50[2] = '\0';
  local_50[3] = '\0';
  local_50[4] = '\0';
  local_50[5] = '\0';
  local_50[6] = '\0';
  local_50[7] = '\0';
  local_48 = uVar3;
  local_40._0_4_ = local_58._0_4_;
  Diligent::
  FormatString<char[22],std::__cxx11::string,char[16],char[13],char[9],Diligent::MemorySizeFormatter<unsigned_long>,char[13],unsigned_int,char[28],Diligent::MemorySizeFormatter<unsigned_long>>
            (&_msg,(Diligent *)"VulkanMemoryManager \'",(char (*) [22])&this->m_MgrName,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"\': created new "
             ,(char (*) [16])Args_2,(char (*) [13])" page. (",(char (*) [9])&local_48,
             (MemorySizeFormatter<unsigned_long> *)", type idx: ",
             (char (*) [13])&MemoryTypeIndex_local,(uint *)"). Current allocated size: ",
             (char (*) [28])&local_60,(MemorySizeFormatter<unsigned_long> *)0x2);
  if (Diligent::DebugMessageCallback != (undefined *)0x0) {
    (*(code *)Diligent::DebugMessageCallback)(0,_msg._M_dataplus._M_p,0,0,0);
  }
  std::__cxx11::string::~string((string *)&_msg);
  (**this->_vptr_VulkanMemoryManager)
            (this,(VulkanMemoryPage *)
                  ((long)iVar5.
                         super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
                         ._M_cur + 0x18));
  Args_1 = local_1a0;
  VulkanMemoryPage::Allocate
            ((VulkanMemoryAllocation *)&_msg,
             (VulkanMemoryPage *)
             ((long)iVar5.
                    super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
                    ._M_cur + 0x18),size,(VkDeviceSize)local_1a0);
  uVar9 = _msg.field_2._M_allocated_capacity;
  val = _msg._M_string_length;
  _Var2 = _msg._M_dataplus;
  local_1b0->Page = (VulkanMemoryPage *)_msg._M_dataplus._M_p;
  local_1b0->UnalignedOffset = _msg._M_string_length;
  local_1b0->Size = _msg.field_2._M_allocated_capacity;
  _msg._M_dataplus._M_p = (pointer)0x0;
  _msg._M_string_length = 0;
  _msg.field_2._M_allocated_capacity = 0;
  VulkanMemoryAllocation::~VulkanMemoryAllocation((VulkanMemoryAllocation *)&_msg);
  if (_Var2._M_p == (pointer)0x0) {
    Diligent::FormatString<char[35]>(&_msg,(char (*) [35])"Failed to allocate new memory page");
    Diligent::DebugAssertionFailed
              (_msg._M_dataplus._M_p,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanMemoryManager.cpp"
               ,199);
  }
  else {
LAB_00279aaf:
    tVar6 = Diligent::AlignUp<unsigned_long,unsigned_long>(val,(unsigned_long)local_1a0);
    if ((size - val) + tVar6 <= (ulong)uVar9) goto LAB_00279b06;
    Diligent::FormatString<char[26],char[112]>
              (&_msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "Size + Diligent::AlignUp(Allocation.UnalignedOffset, Alignment) - Allocation.UnalignedOffset <= Allocation.Size"
               ,Args_1);
    Diligent::DebugAssertionFailed
              (_msg._M_dataplus._M_p,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanMemoryManager.cpp"
               ,0xcc);
  }
  std::__cxx11::string::~string((string *)&_msg);
LAB_00279b06:
  LOCK();
  paVar1 = (this->m_CurrUsedSize)._M_elems + HostVisible;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + uVar9;
  UNLOCK();
  uVar7 = (this->m_CurrUsedSize)._M_elems[HostVisible].super___atomic_base<long>._M_i;
  uVar3 = (this->m_PeakUsedSize)._M_elems[HostVisible];
  if (uVar7 < uVar3) {
    uVar7 = uVar3;
  }
  (this->m_PeakUsedSize)._M_elems[HostVisible] = uVar7;
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_PagesMtx);
  return local_1b0;
}

Assistant:

VulkanMemoryAllocation VulkanMemoryManager::Allocate(VkDeviceSize Size, VkDeviceSize Alignment, uint32_t MemoryTypeIndex, bool HostVisible, VkMemoryAllocateFlags AllocateFlags)
{
    VulkanMemoryAllocation Allocation;

    // On integrated GPUs, there is no difference between host-visible and GPU-only
    // memory, so MemoryTypeIndex is the same. As GPU-only pages do not have CPU address,
    // we need to use HostVisible flag to differentiate the two.
    // It is likely a good idea to always keep staging pages separate to reduce fragmentation
    // even though on integrated GPUs same pages can be used for both GPU-only and staging
    // allocations. Staging allocations are short-living and will be released when upload is
    // complete, while GPU-only allocations are expected to be long-living.
    MemoryPageIndex             PageIdx{MemoryTypeIndex, HostVisible, AllocateFlags};
    std::lock_guard<std::mutex> Lock{m_PagesMtx};

    auto range = m_Pages.equal_range(PageIdx);
    for (auto page_it = range.first; page_it != range.second; ++page_it)
    {
        Allocation = page_it->second.Allocate(Size, Alignment);
        if (Allocation.Page != nullptr)
            break;
    }

    size_t stat_ind = HostVisible ? 1 : 0;
    if (Allocation.Page == nullptr)
    {
        auto PageSize = HostVisible ? m_HostVisiblePageSize : m_DeviceLocalPageSize;
        while (PageSize < Size)
            PageSize *= 2;

        m_CurrAllocatedSize[stat_ind] += PageSize;
        m_PeakAllocatedSize[stat_ind] = std::max(m_PeakAllocatedSize[stat_ind], m_CurrAllocatedSize[stat_ind]);

        auto it = m_Pages.emplace(PageIdx, VulkanMemoryPage{*this, PageSize, MemoryTypeIndex, HostVisible, AllocateFlags});
        LOG_INFO_MESSAGE("VulkanMemoryManager '", m_MgrName, "': created new ", (HostVisible ? "host-visible" : "device-local"),
                         " page. (", Diligent::FormatMemorySize(PageSize, 2), ", type idx: ", MemoryTypeIndex,
                         "). Current allocated size: ", Diligent::FormatMemorySize(m_CurrAllocatedSize[stat_ind], 2));
        OnNewPageCreated(it->second);
        Allocation = it->second.Allocate(Size, Alignment);
        DEV_CHECK_ERR(Allocation.Page != nullptr, "Failed to allocate new memory page");
    }

    if (Allocation.Page != nullptr)
    {
        VERIFY_EXPR(Size + Diligent::AlignUp(Allocation.UnalignedOffset, Alignment) - Allocation.UnalignedOffset <= Allocation.Size);
    }

    m_CurrUsedSize[stat_ind].fetch_add(Allocation.Size);
    m_PeakUsedSize[stat_ind] = std::max(m_PeakUsedSize[stat_ind], static_cast<VkDeviceSize>(m_CurrUsedSize[stat_ind].load()));

    return Allocation;
}